

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetPatternForSkeleton
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  charcount_t cchUseLength;
  charcount_t cVar5;
  int iVar6;
  undefined4 *puVar7;
  JavascriptString *pJVar8;
  JavascriptString *pJVar9;
  char *message;
  undefined4 extraout_var;
  LPCSTR pCVar10;
  Recycler *alloc;
  UChar *buf;
  Recycler *pRVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *error;
  uint uVar12;
  uint in_stack_00000010;
  Var in_stack_00000020;
  Var in_stack_00000028;
  char local_1c8 [8];
  char localeID [157];
  char baseLocaleID [157];
  TrackAllocData data;
  JavascriptString *skeleton;
  ScopedUDateTimePatternGenerator dtpg;
  UErrorCode status;
  UErrorCode status_1;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar12 = callInfo._0_4_;
  if (in_stack_00000010 != uVar12) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xaf3,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a2e976;
    *puVar7 = 0;
  }
  if ((uVar12 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xaf3,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a2e976;
    *puVar7 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar12 & 0xffffff) == 3) {
    bVar3 = VarIs<Js::JavascriptString>(in_stack_00000020);
    if ((!bVar3) || (bVar3 = VarIs<Js::JavascriptString>(in_stack_00000028), !bVar3))
    goto LAB_00a2e3ff;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xaf3,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar3) goto LAB_00a2e976;
      *puVar7 = 0;
    }
LAB_00a2e3ff:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xaf4,
                                "((args.Info.Count == 3 && VarIs<JavascriptString>(args.Values[1]) && VarIs<JavascriptString>(args.Values[2])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00a2e976;
    *puVar7 = 0;
  }
  pJVar8 = UnsafeVarTo<Js::JavascriptString>(in_stack_00000020);
  pJVar9 = UnsafeVarTo<Js::JavascriptString>(in_stack_00000028);
  dtpg.object._0_4_ = 0;
  memset((char (*) [157])local_1c8,0,0x9d);
  LangtagToLocaleID<157ul>(pJVar8,(char (*) [157])local_1c8);
  memset(localeID + 0x98,0,0x9d);
  iVar4 = uloc_getBaseName_70((char (*) [157])local_1c8,localeID + 0x98,0x9d,&dtpg);
  if ((int)dtpg.object == 7) {
    Throw::OutOfMemory();
  }
  if ((int)dtpg.object < 1 && (int)dtpg.object != -0x7c) {
    if (0x9b < iVar4 - 1U) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      error = "(baseLocaleIDLength > 0 && baseLocaleIDLength < 157)";
      message = "baseLocaleIDLength > 0 && baseLocaleIDLength < 157";
      goto LAB_00a2e565;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    message = (char *)u_errorName_70((int)dtpg.object);
    error = "(false)";
LAB_00a2e565:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb08,error,message);
    if (!bVar3) goto LAB_00a2e976;
    *puVar7 = 0;
  }
  iVar4 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar8);
  Output::Trace(IntlPhase,
                L"%S(): Converted input langtag \'%s\' to base locale ID \'%S\' for pattern generation\n"
                ,"EntryIntl_GetPatternForSkeleton",CONCAT44(extraout_var,iVar4),localeID + 0x98);
  skeleton = (JavascriptString *)udatpg_open_70(localeID + 0x98,&dtpg);
  if ((int)dtpg.object == 7) {
    Throw::OutOfMemory();
  }
  if (0 < (int)dtpg.object || (int)dtpg.object == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    pCVar10 = (LPCSTR)u_errorName_70((int)dtpg.object);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb0d,"(false)",pCVar10);
    if (!bVar3) goto LAB_00a2e976;
    *puVar7 = 0;
  }
  pRVar11 = pSVar1->recycler;
  data._32_8_ = &skeleton;
  dtpg.object._4_4_ = 0;
  stack0xffffffffffffff78 = &char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 8;
  data.count = (size_t)anon_var_dwarf_65688cc;
  data.filename._0_4_ = 0x159;
  alloc = Memory::Recycler::TrackAllocInfo(pRVar11,(TrackAllocData *)(baseLocaleID + 0x98));
  buf = (UChar *)new__<Memory::Recycler>(0x10,alloc,0x37fe86);
  cchUseLength = EntryIntl_GetPatternForSkeleton::anon_class_16_2_aae633bf::operator()
                           ((anon_class_16_2_aae633bf *)&data.line,buf,8,
                            (UErrorCode *)((long)&dtpg.object + 4));
  if ((int)cchUseLength < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar3) goto LAB_00a2e976;
    *puVar7 = 0;
  }
  if ((dtpg.object._4_4_ == 0xf) || (dtpg.object._4_4_ == -0x7c)) {
    if ((int)cchUseLength < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar3) goto LAB_00a2e976;
      *puVar7 = 0;
    }
    uVar12 = cchUseLength + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar12);
    dtpg.object._4_4_ = 0;
    stack0xffffffffffffff78 = &char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_65688cc;
    data.filename._0_4_ = 0x162;
    data.plusSize = (long)(int)uVar12;
    pRVar11 = Memory::Recycler::TrackAllocInfo(pRVar11,(TrackAllocData *)(baseLocaleID + 0x98));
    buf = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                    ((Memory *)pRVar11,(Recycler *)Memory::Recycler::AllocLeaf,0,(long)(int)uVar12);
    cVar5 = EntryIntl_GetPatternForSkeleton::anon_class_16_2_aae633bf::operator()
                      ((anon_class_16_2_aae633bf *)&data.line,buf,uVar12,
                       (UErrorCode *)((long)&dtpg.object + 4));
    if (cVar5 != cchUseLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      cchUseLength = cVar5;
      goto joined_r0x00a2e842;
    }
  }
  else if (7 < (int)cchUseLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00a2e842:
    if (!bVar3) goto LAB_00a2e976;
    *puVar7 = 0;
  }
  if (0 < dtpg.object._4_4_ || dtpg.object._4_4_ == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    pCVar10 = (LPCSTR)u_errorName_70(dtpg.object._4_4_);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar10);
    if (!bVar3) {
LAB_00a2e976:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  iVar4 = (*(pJVar9->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])();
  iVar6 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar8);
  Output::Trace(IntlPhase,
                L"%S(): Best pattern \'%s\' will be used for skeleton \'%s\' and langtag \'%s\'\n",
                "EntryIntl_GetPatternForSkeleton",buf,CONCAT44(extraout_var_00,iVar4),
                CONCAT44(extraout_var_01,iVar6));
  pJVar8 = JavascriptString::NewWithBuffer(buf,cchUseLength,pSVar1);
  PlatformAgnostic::ICUHelpers::ScopedICUObject<void_**,_&udatpg_close_70>::~ScopedICUObject
            ((ScopedICUObject<void_**,_&udatpg_close_70> *)&skeleton);
  return pJVar8;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetPatternForSkeleton(RecyclableObject *function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 3 && VarIs<JavascriptString>(args.Values[1]) && VarIs<JavascriptString>(args.Values[2]));

        JavascriptString *langtag = UnsafeVarTo<JavascriptString>(args.Values[1]);
        JavascriptString *skeleton = UnsafeVarTo<JavascriptString>(args.Values[2]);
        UErrorCode status = U_ZERO_ERROR;
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        LangtagToLocaleID(langtag, localeID);

        // See https://github.com/tc39/ecma402/issues/225
        // When picking a format, we should be using the locale data of the basename of the resolved locale,
        // compared to when we actually format the date using the format string, where we use the full locale including extensions
        //
        // ECMA 402 #sec-initializedatetimeformat
        // 10: Let localeData be %DateTimeFormat%.[[LocaleData]].
        // 11: Let r be ResolveLocale( %DateTimeFormat%.[[AvailableLocales]], requestedLocales, opt, %DateTimeFormat%.[[RelevantExtensionKeys]], localeData).
        // 16: Let dataLocale be r.[[dataLocale]].
        // 23: Let dataLocaleData be localeData.[[<dataLocale>]].
        // 24: Let formats be dataLocaleData.[[formats]].
        char baseLocaleID[ULOC_FULLNAME_CAPACITY] = { 0 };
        int baseLocaleIDLength = uloc_getBaseName(localeID, baseLocaleID, _countof(baseLocaleID), &status);
        ICU_ASSERT(status, baseLocaleIDLength > 0 && baseLocaleIDLength < ULOC_FULLNAME_CAPACITY);

        INTL_TRACE("Converted input langtag '%s' to base locale ID '%S' for pattern generation", langtag->GetSz(), baseLocaleID);

        ScopedUDateTimePatternGenerator dtpg(udatpg_open(baseLocaleID, &status));
        ICU_ASSERT(status, true);

        char16 *formatted = nullptr;
        int formattedLen = 0;

        // OS#17513493 (OSS-Fuzz 7950): It is possible for the skeleton to be a zero-length string
        // because [[Get]] operations are performed on the options object twice, according to spec.
        // Follow-up spec discussion here: https://github.com/tc39/ecma402/issues/237.
        // We need to special-case this because calling udatpg_getBestPatternWithOptions on an empty skeleton
        // will produce an empty pattern, which causes an assert in EnsureBuffer by default.
        // As a result, we pass a final optional parameter to EnsureBuffer to say that zero-length results are OK.
        // TODO(jahorto): re-visit this workaround and the one in FormatDateTime upon resolution of the spec issue.
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return udatpg_getBestPatternWithOptions(
                dtpg,
                reinterpret_cast<const UChar *>(skeleton->GetSz()),
                skeleton->GetLength(),
                UDATPG_MATCH_ALL_FIELDS_LENGTH,
                buf,
                bufLen,
                status
            );
        }, scriptContext->GetRecycler(), &formatted, &formattedLen, /* allowZeroLengthStrings */ true);

        INTL_TRACE("Best pattern '%s' will be used for skeleton '%s' and langtag '%s'", formatted, skeleton->GetSz(), langtag->GetSz());

        return JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext);
#else
        AssertOrFailFastMsg(false, "GetPatternForSkeleton is not implemented outside of ICU");
        return nullptr;
#endif
    }